

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O0

void __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::monotoneDecomposition(SimpleToMonotone *this)

{
  int iVar1;
  QDataBuffer<QPodPoint> *pQVar2;
  bool bVar3;
  qsizetype qVar4;
  Edge *pEVar5;
  QPodPoint *this_00;
  QPodPoint *other;
  int *piVar6;
  Node *pNVar7;
  QDataBuffer<std::pair<int,_int>_> *this_01;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  int i_1;
  Node *node_1;
  Node *node;
  Node *leftEdgeNode;
  int j;
  int index;
  int i;
  QDataBuffer<std::pair<int,_int>_> diagonals;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  Node *in_stack_fffffffffffffdb0;
  Node *in_stack_fffffffffffffdb8;
  int iVar8;
  SimpleToMonotone *in_stack_fffffffffffffdc0;
  SimpleToMonotone *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  Node *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  int local_14c;
  int local_12c;
  char local_120 [32];
  pair<int,_int> local_100;
  char local_f8 [32];
  pair<int,_int> local_d8;
  char local_d0 [32];
  pair<int,_int> local_b0;
  char local_a8 [32];
  pair<int,_int> local_88;
  char local_80 [32];
  pair<int,_int> local_60;
  char local_58 [36];
  pair<int,_int> local_34;
  pair<int,_int> local_2c;
  int local_24;
  QDataBuffer<std::pair<int,_int>_> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::isEmpty
                    ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                     (in_RDI + 3));
  if (!bVar3) {
    local_20.capacity = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_20.siz = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_20.buffer = (pair<int,_int> *)&DAT_aaaaaaaaaaaaaaaa;
    QDataBuffer<int>::size((QDataBuffer<int> *)(in_RDI + 6));
    QDataBuffer<std::pair<int,_int>_>::QDataBuffer
              ((QDataBuffer<std::pair<int,_int>_> *)in_stack_fffffffffffffdb0,
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    local_24 = 0;
    for (local_12c = 1;
        qVar4 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::size
                          ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                           (in_RDI + 3)), local_12c < qVar4; local_12c = local_12c + 1) {
      pQVar2 = (QDataBuffer<QPodPoint> *)*in_RDI;
      pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                         ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                          (in_RDI + 3),(long)local_12c);
      this_00 = QDataBuffer<QPodPoint>::at(pQVar2,(ulong)pEVar5->from);
      pQVar2 = (QDataBuffer<QPodPoint> *)*in_RDI;
      pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                         ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                          (in_RDI + 3),(long)local_24);
      other = QDataBuffer<QPodPoint>::at(pQVar2,(ulong)pEVar5->from);
      bVar3 = QPodPoint::operator<(this_00,other);
      if (bVar3) {
        local_24 = local_12c;
      }
    }
    pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                       ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                        (in_RDI + 3),(long)local_24);
    iVar1 = pEVar5->previous;
    pQVar2 = (QDataBuffer<QPodPoint> *)*in_RDI;
    pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                       ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                        (in_RDI + 3),(long)local_24);
    QDataBuffer<QPodPoint>::at(pQVar2,(ulong)pEVar5->from);
    pQVar2 = (QDataBuffer<QPodPoint> *)*in_RDI;
    pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                       ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                        (in_RDI + 3),(long)iVar1);
    QDataBuffer<QPodPoint>::at(pQVar2,(ulong)pEVar5->from);
    pQVar2 = (QDataBuffer<QPodPoint> *)*in_RDI;
    pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                       ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                        (in_RDI + 3),(long)local_24);
    QDataBuffer<QPodPoint>::at(pQVar2,(ulong)pEVar5->to);
    bVar3 = qPointIsLeftOfLine((QPodPoint *)in_stack_fffffffffffffdb0,
                               (QPodPoint *)
                               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                               (QPodPoint *)0x68236e);
    *(bool *)(in_RDI + 9) = bVar3;
    classifyVertices(in_stack_fffffffffffffdc0);
    fillPriorityQueue(in_stack_fffffffffffffdd0);
    while (bVar3 = QDataBuffer<int>::isEmpty((QDataBuffer<int> *)(in_RDI + 6)),
          ((bVar3 ^ 0xffU) & 1) != 0) {
      piVar6 = QDataBuffer<int>::last((QDataBuffer<int> *)(in_RDI + 6));
      local_24 = *piVar6;
      QDataBuffer<int>::pop_back((QDataBuffer<int> *)(in_RDI + 6));
      pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                         ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                          (in_RDI + 3),(long)local_24);
      iVar1 = pEVar5->previous;
      pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                         ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                          (in_RDI + 3),(long)local_24);
      switch(pEVar5->type) {
      case MergeVertex:
        QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                  ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)(in_RDI + 3),
                   (long)local_24);
        pNVar7 = searchEdgeLeftOfPoint
                           ((SimpleToMonotone *)
                            CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        if (pNVar7 == (Node *)0x0) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                     (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          QMessageLogger::warning(local_d0,"Inconsistent polygon. (#4)");
        }
        else {
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              (in_RDI + 3),(long)pNVar7->data);
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              (in_RDI + 3),(long)pEVar5->helper);
          if (pEVar5->type == MergeVertex) {
            pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                               ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                                (in_RDI + 3),(long)pNVar7->data);
            std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_b0,&local_24,&pEVar5->helper);
            QDataBuffer<std::pair<int,_int>_>::add
                      ((QDataBuffer<std::pair<int,_int>_> *)in_stack_fffffffffffffdb0,
                       (pair<int,_int> *)
                       CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          }
          in_stack_fffffffffffffddc = local_24;
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              (in_RDI + 3),(long)pNVar7->data);
          pEVar5->helper = in_stack_fffffffffffffddc;
        }
      case EndVertex:
        if ((*(byte *)(in_RDI + 9) & 1) == 0) {
          in_stack_fffffffffffffdc0 = (SimpleToMonotone *)(in_RDI + 3);
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              (in_RDI + 3),(long)iVar1);
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              in_stack_fffffffffffffdc0,(long)pEVar5->helper);
          if (pEVar5->type == MergeVertex) {
            pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                               ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                                (in_RDI + 3),(long)iVar1);
            std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_100,&local_24,&pEVar5->helper);
            QDataBuffer<std::pair<int,_int>_>::add
                      ((QDataBuffer<std::pair<int,_int>_> *)in_stack_fffffffffffffdb0,
                       (pair<int,_int> *)
                       CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          }
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              (in_RDI + 3),(long)iVar1);
          if (pEVar5->node == (Node *)0x0) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8
                       ,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
            QMessageLogger::warning(local_120,"Inconsistent polygon. (#6)");
          }
          else {
            in_stack_fffffffffffffdb8 = (Node *)(in_RDI + 1);
            QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                      ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                       (in_RDI + 3),(long)iVar1);
            QRBTree<int>::deleteNode
                      ((QRBTree<int> *)in_stack_fffffffffffffdb0,
                       (Node **)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          }
        }
        else {
          in_stack_fffffffffffffdd0 = (SimpleToMonotone *)(in_RDI + 3);
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              (in_RDI + 3),(long)local_24);
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              in_stack_fffffffffffffdd0,(long)pEVar5->helper);
          if (pEVar5->type == MergeVertex) {
            pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                               ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                                (in_RDI + 3),(long)local_24);
            std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_d8,&local_24,&pEVar5->helper);
            QDataBuffer<std::pair<int,_int>_>::add
                      ((QDataBuffer<std::pair<int,_int>_> *)in_stack_fffffffffffffdb0,
                       (pair<int,_int> *)
                       CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          }
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              (in_RDI + 3),(long)local_24);
          if (pEVar5->node == (Node *)0x0) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8
                       ,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
            QMessageLogger::warning(local_f8,"Inconsistent polygon. (#5)");
          }
          else {
            QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                      ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                       (in_RDI + 3),(long)local_24);
            QRBTree<int>::deleteNode
                      ((QRBTree<int> *)in_stack_fffffffffffffdb0,
                       (Node **)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          }
        }
        break;
      case RegularVertex:
        pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                           ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                            (in_RDI + 3),(long)local_24);
        if ((pEVar5->pointingUp & 1U) == (*(byte *)(in_RDI + 9) & 1)) {
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              (in_RDI + 3),(long)local_24);
          if (pEVar5->node == (Node *)0x0) {
            pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                               ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                                (in_RDI + 3),(long)iVar1);
            if (pEVar5->node == (Node *)0x0) {
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)in_stack_fffffffffffffdc0,
                         (char *)in_stack_fffffffffffffdb8,
                         (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                         (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
              QMessageLogger::warning(local_58,"Inconsistent polygon. (#1)");
            }
            else {
              pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                                 ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>
                                   *)(in_RDI + 3),(long)iVar1);
              pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                                 ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>
                                   *)(in_RDI + 3),(long)pEVar5->helper);
              if (pEVar5->type == MergeVertex) {
                pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                                   ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>
                                     *)(in_RDI + 3),(long)iVar1);
                std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_34,&local_24,&pEVar5->helper);
                QDataBuffer<std::pair<int,_int>_>::add
                          ((QDataBuffer<std::pair<int,_int>_> *)in_stack_fffffffffffffdb0,
                           (pair<int,_int> *)
                           CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
              }
              pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                                 ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>
                                   *)(in_RDI + 3),(long)iVar1);
              pNVar7 = pEVar5->node;
              pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                                 ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>
                                   *)(in_RDI + 3),(long)local_24);
              pEVar5->node = pNVar7;
              pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                                 ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>
                                   *)(in_RDI + 3),(long)iVar1);
              iVar1 = local_24;
              pEVar5->node = (Node *)0x0;
              pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                                 ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>
                                   *)(in_RDI + 3),(long)local_24);
              iVar8 = local_24;
              pEVar5->node->data = iVar1;
              pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                                 ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>
                                   *)(in_RDI + 3),(long)local_24);
              pEVar5->helper = iVar8;
            }
          }
          else {
            pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                               ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                                (in_RDI + 3),(long)local_24);
            pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                               ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                                (in_RDI + 3),(long)pEVar5->helper);
            if (pEVar5->type == MergeVertex) {
              pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                                 ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>
                                   *)(in_RDI + 3),(long)local_24);
              std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_2c,&local_24,&pEVar5->helper);
              QDataBuffer<std::pair<int,_int>_>::add
                        ((QDataBuffer<std::pair<int,_int>_> *)in_stack_fffffffffffffdb0,
                         (pair<int,_int> *)
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
            }
            pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                               ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                                (in_RDI + 3),(long)local_24);
            pNVar7 = pEVar5->node;
            pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                               ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                                (in_RDI + 3),(long)iVar1);
            pEVar5->node = pNVar7;
            pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                               ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                                (in_RDI + 3),(long)local_24);
            pEVar5->node = (Node *)0x0;
            pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                               ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                                (in_RDI + 3),(long)iVar1);
            iVar8 = local_24;
            pEVar5->node->data = iVar1;
            pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                               ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                                (in_RDI + 3),(long)iVar1);
            pEVar5->helper = iVar8;
          }
        }
        else {
          QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                    ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                     (in_RDI + 3),(long)local_24);
          pNVar7 = searchEdgeLeftOfPoint
                             ((SimpleToMonotone *)
                              CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                              (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
          if (pNVar7 == (Node *)0x0) {
            QMessageLogger::QMessageLogger
                      ((QMessageLogger *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8
                       ,(int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
            QMessageLogger::warning(local_80,"Inconsistent polygon. (#2)");
          }
          else {
            pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                               ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                                (in_RDI + 3),(long)pNVar7->data);
            pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                               ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                                (in_RDI + 3),(long)pEVar5->helper);
            if (pEVar5->type == MergeVertex) {
              pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                                 ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>
                                   *)(in_RDI + 3),(long)pNVar7->data);
              std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_60,&local_24,&pEVar5->helper);
              QDataBuffer<std::pair<int,_int>_>::add
                        ((QDataBuffer<std::pair<int,_int>_> *)in_stack_fffffffffffffdb0,
                         (pair<int,_int> *)
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
            }
            iVar1 = local_24;
            pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                               ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                                (in_RDI + 3),(long)pNVar7->data);
            pEVar5->helper = iVar1;
          }
        }
        break;
      case SplitVertex:
        QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                  ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)(in_RDI + 3),
                   (long)local_24);
        pNVar7 = searchEdgeLeftOfPoint
                           ((SimpleToMonotone *)
                            CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            (int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
        if (pNVar7 == (Node *)0x0) {
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                     (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
          QMessageLogger::warning(local_a8,"Inconsistent polygon. (#3)");
        }
        else {
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              (in_RDI + 3),(long)pNVar7->data);
          std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_88,&local_24,&pEVar5->helper);
          QDataBuffer<std::pair<int,_int>_>::add
                    ((QDataBuffer<std::pair<int,_int>_> *)in_stack_fffffffffffffdb0,
                     (pair<int,_int> *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
                    );
          iVar8 = local_24;
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              (in_RDI + 3),(long)pNVar7->data);
          pEVar5->helper = iVar8;
        }
      case StartVertex:
        iVar8 = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
        if ((*(byte *)(in_RDI + 9) & 1) == 0) {
          searchEdgeLeftOfEdge(in_stack_fffffffffffffdc0,iVar8);
          in_stack_fffffffffffffde8 =
               QRBTree<int>::newNode((QRBTree<int> *)in_stack_fffffffffffffdb8);
          in_stack_fffffffffffffde8->data = local_24;
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              (in_RDI + 3),(long)local_24);
          pEVar5->node = in_stack_fffffffffffffde8;
          in_stack_fffffffffffffdf4 = local_24;
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              (in_RDI + 3),(long)local_24);
          pEVar5->helper = in_stack_fffffffffffffdf4;
          QRBTree<int>::attachAfter
                    ((QRBTree<int> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                     in_stack_fffffffffffffdb0);
        }
        else {
          searchEdgeLeftOfEdge(in_stack_fffffffffffffdc0,iVar8);
          pNVar7 = QRBTree<int>::newNode((QRBTree<int> *)in_stack_fffffffffffffdb8);
          pNVar7->data = iVar1;
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              (in_RDI + 3),(long)iVar1);
          iVar8 = local_24;
          pEVar5->node = pNVar7;
          pEVar5 = QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge>::at
                             ((QDataBuffer<QTriangulator<unsigned_int>::SimpleToMonotone::Edge> *)
                              (in_RDI + 3),(long)iVar1);
          pEVar5->helper = iVar8;
          QRBTree<int>::attachAfter
                    ((QRBTree<int> *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                     in_stack_fffffffffffffdb0);
        }
      }
    }
    local_14c = 0;
    while( true ) {
      this_01 = (QDataBuffer<std::pair<int,_int>_> *)(long)local_14c;
      qVar4 = QDataBuffer<std::pair<int,_int>_>::size(&local_20);
      if (qVar4 <= (long)this_01) break;
      QDataBuffer<std::pair<int,_int>_>::at(&local_20,(long)local_14c);
      QDataBuffer<std::pair<int,_int>_>::at(&local_20,(long)local_14c);
      createDiagonal((SimpleToMonotone *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                     (int)((ulong)in_stack_fffffffffffffdd0 >> 0x20),(int)in_stack_fffffffffffffdd0)
      ;
      local_14c = local_14c + 1;
    }
    QDataBuffer<std::pair<int,_int>_>::~QDataBuffer(this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTriangulator<T>::SimpleToMonotone::monotoneDecomposition()
{
    if (m_edges.isEmpty())
        return;

    Q_ASSERT(!m_edgeList.root);
    QDataBuffer<std::pair<int, int> > diagonals(m_upperVertex.size());

    int i = 0;
    for (int index = 1; index < m_edges.size(); ++index) {
        if (m_parent->m_vertices.at(m_edges.at(index).from) < m_parent->m_vertices.at(m_edges.at(i).from))
            i = index;
    }
    Q_ASSERT(i < m_edges.size());
    int j = m_edges.at(i).previous;
    Q_ASSERT(j < m_edges.size());
    m_clockwiseOrder = qPointIsLeftOfLine(m_parent->m_vertices.at((quint32)m_edges.at(i).from),
        m_parent->m_vertices.at((quint32)m_edges.at(j).from), m_parent->m_vertices.at((quint32)m_edges.at(i).to));

    classifyVertices();
    fillPriorityQueue();

    // debug: set helpers explicitly (shouldn't be necessary)
    //for (int i = 0; i < m_edges.size(); ++i)
    //    m_edges.at(i).helper = m_edges.at(i).upper();

    while (!m_upperVertex.isEmpty()) {
        i = m_upperVertex.last();
        Q_ASSERT(i < m_edges.size());
        m_upperVertex.pop_back();
        j = m_edges.at(i).previous;
        Q_ASSERT(j < m_edges.size());

        QRBTree<int>::Node *leftEdgeNode = nullptr;

        switch (m_edges.at(i).type) {
        case RegularVertex:
            // If polygon interior is to the right of the vertex...
            if (m_edges.at(i).pointingUp == m_clockwiseOrder) {
                if (m_edges.at(i).node) {
                    Q_ASSERT(!m_edges.at(j).node);
                    if (m_edges.at(m_edges.at(i).helper).type == MergeVertex)
                        diagonals.add(std::pair<int, int>(i, m_edges.at(i).helper));
                    m_edges.at(j).node = m_edges.at(i).node;
                    m_edges.at(i).node = nullptr;
                    m_edges.at(j).node->data = j;
                    m_edges.at(j).helper = i;
                } else if (m_edges.at(j).node) {
                    Q_ASSERT(!m_edges.at(i).node);
                    if (m_edges.at(m_edges.at(j).helper).type == MergeVertex)
                        diagonals.add(std::pair<int, int>(i, m_edges.at(j).helper));
                    m_edges.at(i).node = m_edges.at(j).node;
                    m_edges.at(j).node = nullptr;
                    m_edges.at(i).node->data = i;
                    m_edges.at(i).helper = i;
                } else {
                    qWarning("Inconsistent polygon. (#1)");
                }
            } else {
                leftEdgeNode = searchEdgeLeftOfPoint(m_edges.at(i).from);
                if (leftEdgeNode) {
                    if (m_edges.at(m_edges.at(leftEdgeNode->data).helper).type == MergeVertex)
                        diagonals.add(std::pair<int, int>(i, m_edges.at(leftEdgeNode->data).helper));
                    m_edges.at(leftEdgeNode->data).helper = i;
                } else {
                    qWarning("Inconsistent polygon. (#2)");
                }
            }
            break;
        case SplitVertex:
            leftEdgeNode = searchEdgeLeftOfPoint(m_edges.at(i).from);
            if (leftEdgeNode) {
                diagonals.add(std::pair<int, int>(i, m_edges.at(leftEdgeNode->data).helper));
                m_edges.at(leftEdgeNode->data).helper = i;
            } else {
                qWarning("Inconsistent polygon. (#3)");
            }
            Q_FALLTHROUGH();
        case StartVertex:
            if (m_clockwiseOrder) {
                leftEdgeNode = searchEdgeLeftOfEdge(j);
                QRBTree<int>::Node *node = m_edgeList.newNode();
                node->data = j;
                m_edges.at(j).node = node;
                m_edges.at(j).helper = i;
                m_edgeList.attachAfter(leftEdgeNode, node);
                Q_ASSERT(m_edgeList.validate());
            } else  {
                leftEdgeNode = searchEdgeLeftOfEdge(i);
                QRBTree<int>::Node *node = m_edgeList.newNode();
                node->data = i;
                m_edges.at(i).node = node;
                m_edges.at(i).helper = i;
                m_edgeList.attachAfter(leftEdgeNode, node);
                Q_ASSERT(m_edgeList.validate());
            }
            break;
        case MergeVertex:
            leftEdgeNode = searchEdgeLeftOfPoint(m_edges.at(i).from);
            if (leftEdgeNode) {
                if (m_edges.at(m_edges.at(leftEdgeNode->data).helper).type == MergeVertex)
                    diagonals.add(std::pair<int, int>(i, m_edges.at(leftEdgeNode->data).helper));
                m_edges.at(leftEdgeNode->data).helper = i;
            } else {
                qWarning("Inconsistent polygon. (#4)");
            }
            Q_FALLTHROUGH();
        case EndVertex:
            if (m_clockwiseOrder) {
                if (m_edges.at(m_edges.at(i).helper).type == MergeVertex)
                    diagonals.add(std::pair<int, int>(i, m_edges.at(i).helper));
                if (m_edges.at(i).node) {
                    m_edgeList.deleteNode(m_edges.at(i).node);
                    Q_ASSERT(m_edgeList.validate());
                } else {
                    qWarning("Inconsistent polygon. (#5)");
                }
            } else {
                if (m_edges.at(m_edges.at(j).helper).type == MergeVertex)
                    diagonals.add(std::pair<int, int>(i, m_edges.at(j).helper));
                if (m_edges.at(j).node) {
                    m_edgeList.deleteNode(m_edges.at(j).node);
                    Q_ASSERT(m_edgeList.validate());
                } else {
                    qWarning("Inconsistent polygon. (#6)");
                }
            }
            break;
        }
    }

    for (int i = 0; i < diagonals.size(); ++i)
        createDiagonal(diagonals.at(i).first, diagonals.at(i).second);
}